

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O3

void test_compile_program(void)

{
  map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  *pmVar1;
  size_t *psVar2;
  _Rb_tree_header *p_Var3;
  Machine local_520;
  Machine local_4b0;
  undefined1 local_440 [8];
  Flattener f;
  _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  local_340;
  size_t local_310;
  int local_308;
  _Rb_tree<Register,_std::pair<const_Register,_FOTermFlattened>,_std::_Select1st<std::pair<const_Register,_FOTermFlattened>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_FOTermFlattened>_>_>
  local_300;
  undefined1 local_2d0 [32];
  _Alloc_hider local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  undefined1 local_290 [32];
  _Alloc_hider local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  undefined1 local_250 [32];
  _Alloc_hider local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  undefined1 local_210 [32];
  _Alloc_hider local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  undefined1 local_1d0 [32];
  _Alloc_hider local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  undefined1 local_190 [32];
  _Alloc_hider local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  undefined1 local_150 [8];
  vector<Inst,_std::allocator<Inst>_> is;
  undefined1 local_120 [8];
  Machine m;
  FOTerm q;
  FOTerm p;
  
  test_create_query();
  test_create_program();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"*** TEST_COMPILE_PROGRAM ***\n",0x1d);
  m.heap._M_t._M_impl._0_4_ = 0;
  m.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  m.heap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  m.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  pmVar1 = &m.regval;
  m.regval._M_t._M_impl._0_4_ = 0;
  m.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  m.regval._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  m.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  m.regval._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  m.h.hix = 0;
  f.m.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&f;
  f.m.heap._M_t._M_impl._0_4_ = 0;
  f.m.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  f.m.heap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  f.m.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  f.m.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&f.m.regval;
  f.m.regval._M_t._M_impl._0_4_ = 0;
  f.m.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  f.m.regval._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  f.m.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  f.m.regval._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  f.m.h.hix = 0;
  f.var2reg._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&f.var2reg;
  f.var2reg._M_t._M_impl._0_4_ = 0;
  f.var2reg._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  f.var2reg._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  f.var2reg._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  f.flat._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&f.flat;
  f.flat._M_t._M_impl._0_4_ = 0;
  f.flat._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  f.flat._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  f.flat._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  f.m.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       f.m.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  f.m.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       f.m.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  f.var2reg._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       f.var2reg._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  f.flat._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       f.flat._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  m.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&m;
  m.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&m;
  m.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pmVar1;
  m.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pmVar1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"*** flattened query: ",0x15);
  std::vector<FOTerm,_std::allocator<FOTerm>_>::vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)local_2d0,
             (vector<FOTerm,_std::allocator<FOTerm>_> *)&m.mode);
  local_2d0._24_4_ =
       (FOTermTag)
       q.params.super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_2b0._M_p = (pointer)&local_2a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b0,q._24_8_,q.name._M_dataplus._M_p + q._24_8_);
  FOTerm::print((FOTerm *)local_2d0,(ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," | program: ",0xc);
  std::vector<FOTerm,_std::allocator<FOTerm>_>::vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)local_290,
             (vector<FOTerm,_std::allocator<FOTerm>_> *)((long)&q.name.field_2 + 8));
  local_290._24_4_ =
       (FOTermTag)
       p.params.super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_270._M_p = (pointer)&local_260;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,p._24_8_,p.name._M_dataplus._M_p + p._24_8_);
  FOTerm::print((FOTerm *)local_290,(ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ***\n",5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_p != &local_260) {
    operator_delete(local_270._M_p,local_260._M_allocated_capacity + 1);
  }
  std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_p != &local_2a0) {
    operator_delete(local_2b0._M_p,local_2a0._M_allocated_capacity + 1);
  }
  std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)local_2d0);
  std::vector<FOTerm,_std::allocator<FOTerm>_>::vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)local_250,
             (vector<FOTerm,_std::allocator<FOTerm>_> *)&m.mode);
  local_250._24_4_ =
       (FOTermTag)
       q.params.super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_230._M_p = (pointer)&local_220;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,q._24_8_,q.name._M_dataplus._M_p + q._24_8_);
  flatten((Flattener *)local_440,(FOTerm *)local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_p != &local_220) {
    operator_delete(local_230._M_p,local_220._M_allocated_capacity + 1);
  }
  std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)local_250);
  std::vector<FOTerm,_std::allocator<FOTerm>_>::vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)local_210,
             (vector<FOTerm,_std::allocator<FOTerm>_> *)((long)&q.name.field_2 + 8));
  local_210._24_4_ =
       (FOTermTag)
       p.params.super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_1f0._M_p = (pointer)&local_1e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,p._24_8_,p.name._M_dataplus._M_p + p._24_8_);
  flatten((Flattener *)local_440,(FOTerm *)local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_p != &local_1e0) {
    operator_delete(local_1f0._M_p,local_1e0._M_allocated_capacity + 1);
  }
  std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)local_210);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"*** flattened representation (page 15) ***\n",0x2b);
  psVar2 = &f.var2reg._M_t._M_impl.super__Rb_tree_header._M_node_count;
  printMap<Register,FOTermFlattened>
            ((ostream *)&std::cout,
             (map<Register,_FOTermFlattened,_std::less<Register>,_std::allocator<std::pair<const_Register,_FOTermFlattened>_>_>
              *)psVar2);
  std::
  _Rb_tree<Register,_std::pair<const_Register,_FOTermFlattened>,_std::_Select1st<std::pair<const_Register,_FOTermFlattened>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_FOTermFlattened>_>_>
  ::_Rb_tree(&local_300,
             (_Rb_tree<Register,_std::pair<const_Register,_FOTermFlattened>,_std::_Select1st<std::pair<const_Register,_FOTermFlattened>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_FOTermFlattened>_>_>
              *)psVar2);
  compileQuery((vector<Inst,_std::allocator<Inst>_> *)local_150,
               (map<Register,_FOTermFlattened,_std::less<Register>,_std::allocator<std::pair<const_Register,_FOTermFlattened>_>_>
                *)&local_300);
  std::
  _Rb_tree<Register,_std::pair<const_Register,_FOTermFlattened>,_std::_Select1st<std::pair<const_Register,_FOTermFlattened>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_FOTermFlattened>_>_>
  ::~_Rb_tree(&local_300);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"*** Running program ",0x14);
  std::vector<FOTerm,_std::allocator<FOTerm>_>::vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)local_1d0,
             (vector<FOTerm,_std::allocator<FOTerm>_> *)((long)&q.name.field_2 + 8));
  local_1d0._24_4_ =
       (FOTermTag)
       p.params.super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_1b0._M_p = (pointer)&local_1a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,p._24_8_,p.name._M_dataplus._M_p + p._24_8_);
  FOTerm::print((FOTerm *)local_1d0,(ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"On query ",9);
  std::vector<FOTerm,_std::allocator<FOTerm>_>::vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)local_190,
             (vector<FOTerm,_std::allocator<FOTerm>_> *)&m.mode);
  local_190._24_4_ =
       (FOTermTag)
       q.params.super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_170._M_p = (pointer)&local_160;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,q._24_8_,q.name._M_dataplus._M_p + q._24_8_);
  FOTerm::print((FOTerm *)local_190,(ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"***\n",4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_p != &local_160) {
    operator_delete(local_170._M_p,local_160._M_allocated_capacity + 1);
  }
  std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_p != &local_1a0) {
    operator_delete(local_1b0._M_p,local_1a0._M_allocated_capacity + 1);
  }
  std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)local_1d0);
  std::
  _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
  ::_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
              *)&f.flat._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
              *)local_120);
  psVar2 = &m.heap._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  ::_Rb_tree(&local_340,
             (_Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
              *)psVar2);
  local_308 = m.h.hix;
  local_310 = m.regval._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::vector<Inst,_std::allocator<Inst>_>::vector
            ((vector<Inst,_std::allocator<Inst>_> *)
             &is.super__Vector_base<Inst,_std::allocator<Inst>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(vector<Inst,_std::allocator<Inst>_> *)local_150);
  runInsts(&local_520,(Machine *)&f.flat._M_t._M_impl.super__Rb_tree_header._M_node_count,
           (vector<Inst,_std::allocator<Inst>_> *)
           &is.super__Vector_base<Inst,_std::allocator<Inst>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage);
  std::
  _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
  ::clear((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
           *)local_120);
  if (local_520.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var3 = &local_520.heap._M_t._M_impl.super__Rb_tree_header;
    m.heap._M_t._M_impl._0_4_ = local_520.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_color
    ;
    m.heap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         local_520.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    m.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_520.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    m.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_520.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_520.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         (_Base_ptr)&m;
    m.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)local_520.heap._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_520.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_520.heap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_520.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    local_520.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  }
  std::
  _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  ::clear((_Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
           *)psVar2);
  if (local_520.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var3 = &local_520.regval._M_t._M_impl.super__Rb_tree_header;
    m.regval._M_t._M_impl._0_4_ =
         local_520.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    m.regval._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         local_520.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    m.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_520.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    m.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_520.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_520.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         (_Base_ptr)pmVar1;
    m.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)local_520.regval._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_520.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_520.regval._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_520.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    local_520.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  }
  m.h.hix = local_520.mode;
  m.regval._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = local_520.h.hix;
  m.regval._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = local_520.s.hix;
  std::
  _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  ::~_Rb_tree(&local_520.regval._M_t);
  std::
  _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
  ::~_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
               *)&local_520);
  std::vector<Inst,_std::allocator<Inst>_>::~vector
            ((vector<Inst,_std::allocator<Inst>_> *)
             &is.super__Vector_base<Inst,_std::allocator<Inst>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::
  _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  ::~_Rb_tree(&local_340);
  std::
  _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
  ::~_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
               *)&f.flat._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"*** final state:**\n",0x13);
  std::
  _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
  ::_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
              *)&local_4b0,
             (_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
              *)local_120);
  std::
  _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  ::_Rb_tree(&local_4b0.regval._M_t,
             (_Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
              *)psVar2);
  local_4b0.mode = m.h.hix;
  local_4b0.h.hix = (undefined4)m.regval._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_4b0.s.hix = m.regval._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
  prettyPrintMachine(&local_4b0);
  std::
  _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  ::~_Rb_tree(&local_4b0.regval._M_t);
  std::
  _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
  ::~_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
               *)&local_4b0);
  std::vector<Inst,_std::allocator<Inst>_>::~vector
            ((vector<Inst,_std::allocator<Inst>_> *)local_150);
  std::
  _Rb_tree<Register,_std::pair<const_Register,_FOTermFlattened>,_std::_Select1st<std::pair<const_Register,_FOTermFlattened>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_FOTermFlattened>_>_>
  ::~_Rb_tree((_Rb_tree<Register,_std::pair<const_Register,_FOTermFlattened>,_std::_Select1st<std::pair<const_Register,_FOTermFlattened>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_FOTermFlattened>_>_>
               *)&f.var2reg._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Register>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Register>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Register>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Register>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Register>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Register>_>_>
               *)&f.m.mode);
  std::
  _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  ::~_Rb_tree((_Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
               *)&f.m.heap._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
  ::~_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
               *)local_440);
  std::
  _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  ::~_Rb_tree((_Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
               *)psVar2);
  std::
  _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
  ::~_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
               *)local_120);
  if ((size_type *)p._24_8_ != &p.name._M_string_length) {
    operator_delete((void *)p._24_8_,p.name._M_string_length + 1);
  }
  std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)((long)&q.name.field_2 + 8));
  if ((size_type *)q._24_8_ != &q.name._M_string_length) {
    operator_delete((void *)q._24_8_,q.name._M_string_length + 1);
  }
  std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)&m.mode);
  return;
}

Assistant:

void test_compile_program() {
    const FOTerm q = test_create_query();
    const FOTerm p = test_create_program();
    std::cout << "*** TEST_COMPILE_PROGRAM ***\n";

    Machine m;
    Flattener f;

    {

        // std::cout << "*** Machine state after compiling query: " << q
        //           << " ***\n";
        // prettyPrintMachine(m);
    }

    std::cout << "*** flattened query: " << q << " | program: " << p << " ***\n";
    (void)flatten(f, q);
    (void)flatten(f, p);

    std::cout << "*** flattened representation (page 15) ***\n";
    printMap(std::cout, f.flat);

    std::vector<Inst> is = compileQuery(f.flat);
    std::cout << "*** Running program " << p << "On query " << q << "***\n";
    m = runInsts(m, is);

    std::cout << "*** final state:**\n";
    prettyPrintMachine(m);
        // runInstsPrettyPrint(std::cout, m, is);

}